

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall CLI::App::get_usage_abi_cxx11_(string *__return_storage_ptr__,App *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  p_Var1 = (this->usage_callback_).super__Function_base._M_manager;
  if (p_Var1 == (_Manager_type)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->usage_)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->usage_)._M_string_length);
  }
  else {
    (*(this->usage_callback_)._M_invoker)(&local_48,(_Any_data *)&this->usage_callback_);
    plVar4 = (long *)::std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_48,local_48._M_string_length,0,'\x01');
    local_68 = &local_58;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_58 = *plVar5;
      lStack_50 = plVar4[3];
    }
    else {
      local_58 = *plVar5;
      local_68 = (long *)*plVar4;
    }
    local_60 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)(this->usage_)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  if (p_Var1 != (_Manager_type)0x0) {
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD std::string get_usage() const {
        return (usage_callback_) ? usage_callback_() + '\n' + usage_ : usage_;
    }